

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O3

void helicsEndpointSetOption(HelicsEndpoint end,int option,int value,HelicsError *err)

{
  if (err == (HelicsError *)0x0) {
    if (end == (HelicsEndpoint)0x0) {
      return;
    }
    if (*(int *)((long)end + 0x20) != -0x4bac6b3e) {
      return;
    }
  }
  else {
    if (err->error_code != 0) {
      return;
    }
    if ((end == (HelicsEndpoint)0x0) || (*(int *)((long)end + 0x20) != -0x4bac6b3e)) {
      err->error_code = -3;
      err->message = "The given endpoint does not point to a valid object";
      return;
    }
  }
  (**(code **)(**end + 0x10))();
  return;
}

Assistant:

void helicsEndpointSetOption(HelicsEndpoint end, int option, int value, HelicsError* err)
{
    auto* endObj = verifyEndpoint(end, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        endObj->endPtr->setOption(option, value);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
    }
    // LCOV_EXCL_STOP
}